

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O2

string * helics::zeromq::getZMQVersion_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator<char> local_11d;
  tuple<int,_int,_int> vers;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  zmq::version();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"ZMQ v",&local_11d);
  CLI::std::__cxx11::to_string
            (&local_d0,
             vers.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
             _M_head_impl);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90,'.');
  CLI::std::__cxx11::to_string
            (&local_f0,
             vers.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
             super__Head_base<1UL,_int,_false>._M_head_impl);
  std::operator+(&local_50,&local_70,&local_f0);
  std::operator+(&local_30,&local_50,'.');
  CLI::std::__cxx11::to_string
            (&local_110,
             (int)vers.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
                  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl);
  std::operator+(in_RDI,&local_30,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return (string *)in_RDI;
}

Assistant:

std::string getZMQVersion()
{
    auto vers = zmq::version();
    return std::string("ZMQ v") + std::to_string(std::get<0>(vers)) + '.' +
        std::to_string(std::get<1>(vers)) + '.' + std::to_string(std::get<2>(vers));
}